

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
calculator::ZeroNumberException::ZeroNumberException(ZeroNumberException *this,int x)

{
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ValueException::ValueException(&this->super_ValueException);
  *(undefined ***)&(this->super_ValueException).super_SyntaxError = &PTR__SyntaxError_001169d8;
  std::__cxx11::to_string(&sStack_58,x);
  std::operator+(&local_38,"Error: zero/0 number error: 0",&sStack_58);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ValueException).super_SyntaxError.error_msg,(string *)&local_38
            );
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

ZeroNumberException(int x) {
        error_msg = "Error: zero/0 number error: 0" + std::to_string(x);
    }